

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glyphs.h
# Opt level: O3

void __thiscall
rengine::GlyphTextureJob::renderSingleGlyph
          (GlyphTextureJob *this,int x,int y,uint *t,int tw,int th,uchar *b,int bw,int bh,int cr,
          int cg,int cb,int ca)

{
  int iVar1;
  uint *puVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  
  if (0 < bh) {
    iVar9 = x;
    if (x < tw) {
      iVar9 = tw;
    }
    if (th <= y) {
      th = y;
    }
    puVar2 = t + (long)y * (long)tw + (long)x;
    uVar8 = 0;
    do {
      if (y < 0) {
        __assert_fail("dy >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/glyphs.h"
                      ,0xe0,
                      "void rengine::GlyphTextureJob::renderSingleGlyph(int, int, unsigned int *, int, int, unsigned char *, int, int, int, int, int, int)"
                     );
      }
      if (uVar8 == (uint)(th - y)) {
        __assert_fail("dy < th",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/glyphs.h"
                      ,0xe1,
                      "void rengine::GlyphTextureJob::renderSingleGlyph(int, int, unsigned int *, int, int, unsigned char *, int, int, int, int, int, int)"
                     );
      }
      if (0 < bw) {
        uVar3 = 0;
        do {
          if (x < 0) {
            __assert_fail("x + xx >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/glyphs.h"
                          ,0xea,
                          "void rengine::GlyphTextureJob::renderSingleGlyph(int, int, unsigned int *, int, int, unsigned char *, int, int, int, int, int, int)"
                         );
          }
          if ((uint)(iVar9 - x) == uVar3) {
            __assert_fail("x + xx < tw",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/glyphs.h"
                          ,0xeb,
                          "void rengine::GlyphTextureJob::renderSingleGlyph(int, int, unsigned int *, int, int, unsigned char *, int, int, int, int, int, int)"
                         );
          }
          if (b[uVar3] != 0) {
            iVar4 = (uint)b[uVar3] * ca;
            iVar1 = iVar4 / 0xff;
            uVar7 = cr;
            iVar6 = cg;
            iVar5 = cb;
            if (0xfe < iVar4 - 0xfe01U) {
              uVar7 = iVar1 * cr >> 8;
              iVar6 = iVar1 * cg >> 8;
              iVar5 = iVar1 * cb >> 8;
            }
            puVar2[uVar3] = iVar6 << 8 | uVar7 | iVar5 << 0x10 | iVar1 * 0x1000000;
          }
          uVar3 = uVar3 + 1;
        } while ((uint)bw != uVar3);
      }
      uVar8 = uVar8 + 1;
      puVar2 = puVar2 + tw;
      b = b + bw;
    } while (uVar8 != (uint)bh);
  }
  return;
}

Assistant:

inline void GlyphTextureJob::renderSingleGlyph(int x, int y,
                                        unsigned int *t, int tw, int th,
                                        unsigned char *b, int bw, int bh,
                                        int cr, int cg, int cb, int ca)
{
    for (int yy=0; yy<bh; ++yy) {
        int dy = yy + y;

        assert(dy >= 0);
        assert(dy < th);
        // if (yy + y < 0)
        //     continue;
        // else if (yy + y > ctx->buffer->height)
        //     break;
        unsigned char *src = b + yy * bw;
        unsigned int *dst = t + dy * tw + x;

        for (int xx=0; xx<bw; ++xx) {
            assert(x + xx >= 0);
            assert(x + xx < tw);
            unsigned char s = src[xx];
            if (s == 0)
                continue;
            // if (xx + x < 0)
            //     continue;
            // else if (xx + x > ctx->buffer->width)
            //     break;
            int alpha = ca * s / 255;

            int r, g, b;
            if (alpha == 255) {
                r = cr;
                g = cg;
                b = cb;
            } else {
                r = (alpha * cr) >> 8;
                g = (alpha * cg) >> 8;
                b = (alpha * cb) >> 8;
            }

            dst[xx] = (alpha << 24)
                      | (b << 16)
                      | (g << 8)
                      | r;
        }
    }
    // color[3] = alpha;

}